

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteInt32
               (int field_number,int32 value,CodedOutputStream *output)

{
  CodedOutputStream *in_RDX;
  int in_EDI;
  uint32 value_00;
  CodedOutputStream *this;
  
  this = in_RDX;
  MakeTag(in_EDI,WIRETYPE_VARINT);
  value_00 = (uint32)((ulong)in_RDX >> 0x20);
  io::CodedOutputStream::WriteTag(this,value_00);
  io::CodedOutputStream::WriteVarint32SignExtended(this,value_00);
  return;
}

Assistant:

void WireFormatLite::WriteInt32(int field_number, int32 value,
                                io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_VARINT, output);
  WriteInt32NoTag(value, output);
}